

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::CheckAndSetOutParamMaxDepth(FunctionBody *this,RegSlot cOutParamsDepth)

{
  CheckNotExecuting(this);
  SetOutParamMaxDepth(this,cOutParamsDepth);
  return;
}

Assistant:

void
    FunctionBody::CheckAndSetOutParamMaxDepth(RegSlot cOutParamsDepth)
    {
        CheckNotExecuting();
        SetOutParamMaxDepth(cOutParamsDepth);
    }